

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

char gear_to_label(player *p,object *obj)

{
  _Bool _Var1;
  wchar_t wVar2;
  int local_5c;
  char local_58 [4];
  wchar_t i;
  char labels [49];
  object *obj_local;
  player *p_local;
  
  unique0x1000025f = obj;
  memcpy(local_58,"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ",0x31);
  _Var1 = object_is_equipped(p->body,stack0xffffffffffffffe0);
  if (_Var1) {
    wVar2 = equipped_item_slot(p->body,stack0xffffffffffffffe0);
    p_local._7_1_ = local_58[wVar2];
  }
  else {
    for (local_5c = 0; local_5c < (int)(uint)z_info->quiver_size; local_5c = local_5c + 1) {
      if (p->upkeep->quiver[local_5c] == stack0xffffffffffffffe0) {
        return (char)local_5c + '0';
      }
    }
    for (local_5c = 0; local_5c < (int)(uint)z_info->pack_size; local_5c = local_5c + 1) {
      if (p->upkeep->inven[local_5c] == stack0xffffffffffffffe0) {
        return local_58[local_5c];
      }
    }
    p_local._7_1_ = '\0';
  }
  return p_local._7_1_;
}

Assistant:

char gear_to_label(struct player *p, struct object *obj)
{
	/* Skip rogue-like cardinal direction movement keys. */
	const char labels[] =
		 "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
	int i;

	/* Equipment is easy */
	if (object_is_equipped(p->body, obj)) {
		return labels[equipped_item_slot(p->body, obj)];
	}

	/* Check the quiver */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (p->upkeep->quiver[i] == obj) {
			return I2D(i);
		}
	}

	/* Check the inventory */
	for (i = 0; i < z_info->pack_size; i++) {
		if (p->upkeep->inven[i] == obj) {
			return labels[i];
		}
	}

	return '\0';
}